

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O0

void mxx::my_mpi_errorhandler(MPI_Comm *param_1,int *error_code,...)

{
  allocator<char> local_179;
  string local_178 [8];
  string errorstr;
  allocator<char> local_141;
  string local_140 [8];
  string classstr;
  int error_class;
  int strlen;
  char buf [256];
  int *error_code_local;
  MPI_Comm *param_0_local;
  
  buf._248_8_ = error_code;
  MPI_Error_class(*error_code,(undefined1 *)((long)&classstr.field_2 + 8));
  MPI_Error_string(classstr.field_2._8_4_,&error_class,(undefined1 *)((long)&classstr.field_2 + 0xc)
                  );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,(char *)&error_class,&local_141);
  std::allocator<char>::~allocator(&local_141);
  MPI_Error_string(*(undefined4 *)buf._248_8_,&error_class,
                   (undefined1 *)((long)&classstr.field_2 + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,(char *)&error_class,&local_179);
  std::allocator<char>::~allocator(&local_179);
  std::terminate();
}

Assistant:

inline void my_mpi_errorhandler(MPI_Comm* /*comm*/, int* error_code, ...) {
    char buf[MPI_MAX_ERROR_STRING];
    int strlen;
    int error_class;

    MPI_Error_class(*error_code, &error_class);
    MPI_Error_string(error_class, buf, &strlen);
    std::string classstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    MPI_Error_string(*error_code, buf, &strlen);
    std::string errorstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    // throw exception, enables gdb stack trace analysis
    std::terminate();
    throw std::runtime_error("[MPI Error] class: " + classstr + "\n[MPI Error] " + errorstr);
}